

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_14dc25::WriteAttribute(FILE *fp,char *name,char *type,uchar *data,int len)

{
  char *__ptr;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  void *in_RCX;
  char *in_RDX;
  char *in_RSI;
  FILE *in_RDI;
  uint in_R8D;
  int outLen;
  size_t n;
  uint local_34;
  size_t local_30;
  uint local_24;
  void *local_20;
  char *local_18;
  char *local_10;
  FILE *local_8;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar2 = strlen(in_RSI);
  sVar2 = fwrite(in_RSI,1,sVar2 + 1,local_8);
  local_30 = sVar2;
  sVar3 = strlen(local_10);
  __ptr = local_18;
  if (sVar2 != sVar3 + 1) {
    __assert_fail("n == strlen(name) + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x1b1a,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  sVar2 = strlen(local_18);
  sVar2 = fwrite(__ptr,1,sVar2 + 1,local_8);
  local_30 = sVar2;
  sVar3 = strlen(local_18);
  if (sVar2 != sVar3 + 1) {
    __assert_fail("n == strlen(type) + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x1b1d,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  local_34 = local_24;
  bVar1 = IsBigEndian();
  if (bVar1) {
    swap4(&local_34);
  }
  local_30 = fwrite(&local_34,1,4,local_8);
  if (local_30 != 4) {
    __assert_fail("n == sizeof(int)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x1b24,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  local_30 = fwrite(local_20,1,(long)(int)local_24,local_8);
  if (local_30 != (long)(int)local_24) {
    __assert_fail("n == (size_t)len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x1b27,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  return;
}

Assistant:

void WriteAttribute(FILE *fp, const char *name, const char *type,
                    const unsigned char *data, int len) {
  size_t n = fwrite(name, 1, strlen(name) + 1, fp);
  assert(n == strlen(name) + 1);

  n = fwrite(type, 1, strlen(type) + 1, fp);
  assert(n == strlen(type) + 1);

  int outLen = len;
  if (IsBigEndian()) {
    swap4(reinterpret_cast<unsigned int *>(&outLen));
  }
  n = fwrite(&outLen, 1, sizeof(int), fp);
  assert(n == sizeof(int));

  n = fwrite(data, 1, len, fp);
  assert(n == (size_t)len);

  (void)n;
}